

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud_color_quantity.cpp
# Opt level: O0

void __thiscall polyscope::PointCloudColorQuantity::draw(PointCloudColorQuantity *this)

{
  bool bVar1;
  element_type *peVar2;
  long in_RDI;
  ShaderProgram *in_stack_00000198;
  PointCloud *in_stack_000001a0;
  PointCloudColorQuantity *in_stack_000001b0;
  ShaderProgram *in_stack_000005d8;
  Structure *in_stack_000005e0;
  nullptr_t in_stack_ffffffffffffffd8;
  shared_ptr<polyscope::render::ShaderProgram> *in_stack_ffffffffffffffe0;
  __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *this_00;
  
  bVar1 = Quantity<polyscope::PointCloud>::isEnabled((Quantity<polyscope::PointCloud> *)0x3983d8);
  if (bVar1) {
    bVar1 = std::operator==(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    if (bVar1) {
      createPointProgram(in_stack_000001b0);
    }
    this_00 = *(__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                **)(in_RDI + 8);
    std::
    __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator*(this_00);
    Structure::setTransformUniforms(in_stack_000005e0,in_stack_000005d8);
    std::
    __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator*(this_00);
    PointCloud::setPointCloudUniforms(in_stack_000001a0,in_stack_00000198);
    peVar2 = std::
             __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x398459);
    (*peVar2->_vptr_ShaderProgram[0x1e])();
  }
  return;
}

Assistant:

void PointCloudColorQuantity::draw() {
  if (!isEnabled()) return;

  // Make the program if we don't have one already
  if (pointProgram == nullptr) {
    createPointProgram();
  }

  parent.setTransformUniforms(*pointProgram);
  parent.setPointCloudUniforms(*pointProgram);

  pointProgram->draw();
}